

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O3

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  int iVar1;
  FILE *pFVar2;
  int iVar3;
  undefined4 in_register_00000034;
  char *str;
  char *str_00;
  char *__s1;
  
  str_00 = (char *)CONCAT44(in_register_00000034,argc);
  this->input_master = (FILE *)0x0;
  this->input_add = _stdin;
  this->output = (FILE *)_stdout;
  this->op = add;
  this->checks = id;
  this->quiet = false;
  if (1 < argc) {
    iVar3 = 1;
    __s1 = (char *)this;
    do {
      str = argv[iVar3];
      if (*str != '-') {
        if (iVar3 != argc + -1) goto switchD_001093d7_caseD_69;
        __s1 = (char *)this;
        parse_input_add(this,str);
        str_00 = str;
        iVar3 = argc + -1;
        goto LAB_0010940c;
      }
      switch(str[1]) {
      case 'h':
        if (str[2] == '\0') {
          argparse::args_t();
LAB_00109536:
          argparse::args_t();
          pFVar2 = _stdout;
          if ((str_00 != (char *)0x0) && ((*str_00 != '-' || (str_00[1] != '\0')))) {
            pFVar2 = fopen(str_00,"wb");
          }
          ((args_t *)__s1)->output = (FILE *)pFVar2;
          if (pFVar2 == (FILE *)0x0) {
            ERROR("failed to open the OUTPUT file %s",str_00);
            return;
          }
          return;
        }
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'n':
      case 'r':
      case 's':
switchD_001093d7_caseD_69:
        __s1 = "unknown argument: %s";
        ERROR("unknown argument: %s");
        str_00 = str;
        break;
      case 'm':
        iVar3 = iVar3 + 1;
        if (iVar3 == argc) {
          ERROR("ran out of command line arguments");
        }
        str_00 = argv[iVar3];
        __s1 = (char *)this;
        parse_input_master(this,str_00);
        break;
      case 'o':
        iVar3 = iVar3 + 1;
        if (iVar3 == argc) {
          ERROR("ran out of command line arguments");
        }
        str_00 = argv[iVar3];
        __s1 = (char *)this;
        parse_output(this,str_00);
        break;
      case 'p':
        iVar3 = iVar3 + 1;
        if (iVar3 == argc) {
          ERROR("ran out of command line arguments");
        }
        str_00 = argv[iVar3];
        __s1 = (char *)this;
        parse_file_operation(this,str_00);
        break;
      case 'q':
        this->quiet = true;
        break;
      case 't':
        iVar3 = iVar3 + 1;
        if (iVar3 == argc) {
          ERROR("ran out of command line arguments");
        }
        str_00 = argv[iVar3];
        __s1 = (char *)this;
        parse_match_mode(this,str_00);
        break;
      default:
        if (str[1] == '-') {
          __s1 = str + 2;
          str_00 = "help";
          iVar1 = strcmp(__s1,"help");
          if (iVar1 == 0) goto LAB_00109536;
        }
        goto switchD_001093d7_caseD_69;
      }
LAB_0010940c:
      iVar3 = iVar3 + 1;
    } while (iVar3 < argc);
    if (this->input_master != (FILE *)0x0) {
      return;
    }
  }
  ERROR("Required argument MASTER FILE was not provided");
  return;
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
    input_master (NULL),
    input_add( stdin ),
    output( stdout ),
    op ( DEFAULT_OPERATION ),
    checks ( DEFAULT_MATCH ),
    quiet (false)
    {
        // skip arg[0], it's just the program name
        for (int i = 1; i < argc; ++i ) {
            const char * arg = argv[i];
            
            if ( arg[0] == '-' && arg[1] == '-' ) {
                if ( !strcmp( &arg[2], "help" ) ) help();
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else if ( arg[0] == '-' ) {
                if ( !strcmp( &arg[1], "h" ) ) help();
                else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
                else if (  arg[1] == 'm')  parse_input_master( next_arg (i, argc, argv) );
                else if (  arg[1] == 'p')  parse_file_operation ( next_arg (i, argc, argv) );
                else if (  arg[1] == 't')  parse_match_mode( next_arg (i, argc, argv) );
                else if (  arg[1] == 'q')  parse_quiet ( );
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else
                if (i == argc-1) {
                    parse_input_add (arg);
                } else {
                    ERROR( "unknown argument: %s", arg );
                }
        }
        
        if (input_master == NULL) {
            ERROR ("Required argument MASTER FILE was not provided");
        }
    }